

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void Hex::Hexdumper<unsigned_short>::output_bin(ostream *os,remove_const_t<unsigned_short> val)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  ostream oVar4;
  ulong uVar5;
  ushort uVar6;
  undefined6 in_register_00000032;
  int iVar7;
  ulong uVar8;
  char bits [257];
  ostream aoStack_12a [2];
  byte abStack_128 [264];
  
  uVar5 = 0;
  uVar8 = CONCAT62(in_register_00000032,val);
  if ((int)CONCAT62(in_register_00000032,val) != 0) {
    do {
      abStack_128[uVar5] = (byte)(uVar8 & 0xffff) & 1 | 0x30;
      uVar5 = uVar5 + 1;
      uVar6 = (ushort)uVar8;
      uVar8 = (uVar8 & 0xffff) >> 1;
    } while (1 < uVar6);
  }
  abStack_128[uVar5 & 0xffffffff] = 0;
  lVar3 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar3;
  iVar2 = *(int *)(os + lVar3 + 0x10);
  if (os[lVar3 + 0xe1] == (ostream)0x1) {
    oVar4 = poVar1[0xe0];
  }
  else {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar7 = (int)uVar5;
  if (iVar7 < iVar2) {
    aoStack_12a[1] = (ostream)0x20;
    if (oVar4 != (ostream)0x0) {
      aoStack_12a[1] = oVar4;
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)(iVar2 - iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(aoStack_12a + 1),1);
  }
  else {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  if (0 < iVar7) {
    uVar8 = (uVar5 & 0xffffffff) + 1;
    do {
      aoStack_12a[1] = aoStack_12a[uVar8];
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(aoStack_12a + 1),1);
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }